

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O1

int nghttp2_map_each(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (map->tablelen == 0) {
    return 0;
  }
  lVar3 = 8;
  uVar4 = 0;
  while ((pvVar1 = *(void **)((long)&map->table->hash + lVar3), pvVar1 == (void *)0x0 ||
         (iVar2 = (*func)(pvVar1,ptr), iVar2 == 0))) {
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
    if (map->tablelen <= uVar4) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_map_each(nghttp2_map *map, int (*func)(void *data, void *ptr),
                     void *ptr) {
  int rv;
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    rv = func(bkt->data, ptr);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}